

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O1

void SystemZ_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  cs_detail *pcVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  MCOperand *op;
  int64_t val;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *O_00;
  SStream *O_01;
  int iVar8;
  char *pcVar9;
  
  uVar6 = MCInst_getOpcode(MI);
  uVar6 = *(uint *)(printInstruction_OpInfo0 + (ulong)uVar6 * 4);
  uVar7 = MCInst_getOpcode(MI);
  uVar3 = *(ushort *)(printInstruction_OpInfo1 + (ulong)uVar7 * 2);
  uVar7 = MCInst_getOpcode(MI);
  bVar2 = printInstruction_OpInfo2[uVar7];
  SStream_concat0(O,&UNK_0051c69f + (uVar6 & 0x3fff));
  switch(uVar6 >> 0xe & 0x1f) {
  case 2:
    printBDAddrOperand(MI,0,O);
    break;
  case 3:
    printBDLAddrOperand(MI,0,O);
    break;
  case 4:
    iVar8 = 0;
    goto LAB_0024fb58;
  case 5:
    printCond4Operand(MI,1,O);
    break;
  case 6:
    printU4ImmOperand(MI,0,O);
    goto LAB_0024f9e0;
  case 7:
    iVar8 = 2;
    goto LAB_0024f9bc;
  case 8:
    printCond4Operand(MI,3,O);
    SStream_concat0(O,anon_var_dwarf_33e887 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    goto switchD_0024ffb1_caseD_a;
  case 9:
    printU16ImmOperand(MI,0,O);
    break;
  case 10:
    printU32ImmOperand(MI,0,O);
    goto LAB_0024fa5e;
  case 0xb:
    op = MCInst_getOperand(MI,0);
    val = MCOperand_getImm(op);
    printInt64(O,val);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[0] * 0x20 + 0x15;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[0] * 0x20 + 0x1d) = val;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
      *puVar1 = *puVar1 + '\x01';
    }
LAB_0024fa5e:
    pcVar9 = ",";
    goto LAB_0024fa65;
  case 0xc:
    iVar8 = 0;
    goto LAB_002501d2;
  case 0xd:
    printOperand(MI,1,O);
    SStream_concat0(O,", ");
  case 1:
    printOperand(MI,0,O);
    break;
  case 0xe:
    printCond4Operand(MI,5,O);
    SStream_concat0(O,anon_var_dwarf_33e887 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    goto switchD_0024fe89_caseD_6;
  case 0xf:
    iVar8 = 4;
LAB_0024f9bc:
    printCond4Operand(MI,iVar8,O);
    SStream_concat0(O,anon_var_dwarf_33e887 + 0x11);
    printOperand(MI,0,O);
LAB_0024f9e0:
    pcVar9 = ", ";
LAB_0024fa65:
    SStream_concat0(O,pcVar9);
    break;
  case 0x10:
    printBDRAddrOperand(MI,0,O);
    SStream_concat0(O,", ");
    printBDAddrOperand(MI,3,O);
    SStream_concat0(O,", ");
    goto switchD_0025016c_caseD_7;
  case 0x11:
    iVar8 = 0;
    goto LAB_0024f81c;
  default:
    goto switchD_0024f803_default;
  }
  switch(uVar6 >> 0x13 & 0x1f) {
  case 1:
    pcVar9 = anon_var_dwarf_33e887 + 0x11;
    goto LAB_0024fc09;
  case 2:
    iVar8 = 1;
    goto LAB_0024fb58;
  case 3:
    pcVar9 = "r\t";
    goto LAB_0024fb8d;
  case 4:
    printOperand(MI,1,O);
    break;
  case 5:
    printPCRelOperand(MI,1,O);
    break;
  case 6:
    goto switchD_0024f803_default;
  case 7:
    printS8ImmOperand(MI,1,O);
  default:
switchD_0024fa90_default:
    pcVar9 = ", ";
LAB_0024fc09:
    SStream_concat0(O,pcVar9);
    break;
  case 8:
    iVar8 = 1;
    goto LAB_0024ffbb;
  case 9:
    iVar8 = 1;
    goto LAB_0024fbdc;
  case 10:
    printU8ImmOperand(MI,1,O);
    goto switchD_0024fa90_default;
  case 0xb:
    SStream_concat0(O,",");
    printOperand(MI,1,O);
    pcVar9 = ",";
LAB_0024fb8d:
    SStream_concat0(O,pcVar9);
switchD_0024fa90_caseD_e:
    iVar8 = 2;
    goto LAB_0024fb9a;
  case 0xc:
    printBDAddrOperand(MI,1,O);
    break;
  case 0xd:
    printBDRAddrOperand(MI,1,O);
    SStream_concat0(O,",");
    printBDAddrOperand(MI,4,O);
    SStream_concat0(O,",");
    iVar8 = 6;
    goto LAB_0024fb9a;
  case 0xe:
    goto switchD_0024fa90_caseD_e;
  case 0xf:
    goto switchD_0024fa90_caseD_f;
  case 0x10:
    iVar8 = 1;
    goto LAB_0024fcd5;
  }
  switch(uVar6 >> 0x18 & 0x3f) {
  case 1:
    iVar8 = 2;
    goto LAB_0024fd1f;
  case 2:
    iVar8 = 1;
LAB_0024fd1f:
    printOperand(MI,iVar8,O);
    break;
  case 3:
    iVar8 = 2;
    goto LAB_0024fd34;
  case 4:
    iVar8 = 2;
    goto LAB_0024fd0a;
  case 5:
    iVar8 = 2;
    goto LAB_0024ff39;
  case 6:
    goto switchD_0024fc34_caseD_6;
  case 7:
    iVar8 = 3;
    goto LAB_0024fd9b;
  case 8:
    iVar8 = 1;
    goto LAB_0024fe55;
  case 9:
    goto switchD_0024f803_default;
  case 10:
    goto switchD_0024fc34_caseD_a;
  case 0xb:
  case 0x10:
    iVar8 = 1;
    goto LAB_002501d2;
  case 0xc:
    goto switchD_0024fc34_caseD_c;
  case 0xd:
    printU4ImmOperand(MI,1,O);
    goto switchD_0024fc34_caseD_a;
  case 0xe:
    printBDLAddrOperand(MI,1,O);
    goto LAB_0024fcbe;
  case 0xf:
    iVar8 = 1;
LAB_0024fd34:
    printS32ImmOperand(MI,iVar8,O);
    return;
  case 0x11:
    iVar8 = 1;
LAB_0024fd0a:
    printS16ImmOperand(MI,iVar8,O);
    break;
  case 0x12:
    iVar8 = 3;
    goto LAB_0024fd86;
  case 0x13:
    printS8ImmOperand(MI,1,O);
    goto switchD_0024fc34_caseD_a;
  case 0x14:
    goto switchD_0024fc34_caseD_14;
  case 0x15:
    iVar8 = 2;
    goto LAB_0024fbdc;
  case 0x16:
    iVar8 = 1;
    goto LAB_0024fea0;
  case 0x17:
    printU16ImmOperand(MI,1,O);
    break;
  case 0x18:
    printU8ImmOperand(MI,1,O);
    goto switchD_0024fc34_caseD_a;
  case 0x19:
    printU4ImmOperand(MI,3,O);
    break;
  case 0x1a:
    iVar8 = 1;
    goto LAB_0024fd86;
  case 0x1b:
    iVar8 = 2;
    goto LAB_0024f81c;
  case 0x1c:
    iVar8 = 2;
LAB_0024fd86:
    printBDAddrOperand(MI,iVar8,O);
    break;
  case 0x1d:
    printU4ImmOperand(MI,2,O);
    SStream_concat0(O,", ");
    goto switchD_0025016c_caseD_5;
  case 0x1e:
    pcVar9 = ",";
    goto LAB_0024fe01;
  case 0x1f:
    iVar8 = 2;
LAB_0024fd9b:
    printBDLAddrOperand(MI,iVar8,O);
    return;
  case 0x20:
    iVar8 = 2;
    goto LAB_0024fdb9;
  case 0x21:
    iVar8 = 1;
LAB_0024fdb9:
    printBDVAddrOperand(MI,iVar8,O);
switchD_0024fc34_caseD_a:
    pcVar9 = ", ";
LAB_0024fe01:
    SStream_concat0(O,pcVar9);
    break;
  default:
    iVar8 = 2;
LAB_0024fe55:
    printBDXAddrOperand(MI,iVar8,O);
  }
  switch((uint)(CONCAT24(uVar3,uVar6) >> 0x1e) & 0x1f) {
  case 2:
    goto switchD_0024fe89_caseD_2;
  case 3:
    goto switchD_0024fc34_caseD_c;
  case 4:
    printOperand(MI,2,O);
    O_00 = extraout_RDX_00;
    break;
  case 5:
    printU4ImmOperand(MI,2,O);
  case 1:
    SStream_concat0(O,", ");
    O_00 = extraout_RDX_02;
    break;
  case 6:
switchD_0024fe89_caseD_6:
    iVar8 = 2;
    goto LAB_0024f99e;
  case 7:
    printBDAddrOperand(MI,3,O);
    O_00 = extraout_RDX;
    break;
  case 8:
    goto switchD_0024fc34_caseD_14;
  case 9:
    goto switchD_0024fa90_caseD_f;
  case 10:
switchD_0024fc34_caseD_6:
    iVar8 = 2;
LAB_0024fea0:
    printU32ImmOperand(MI,iVar8,O);
    return;
  case 0xb:
    printS8ImmOperand(MI,2,O);
    SStream_concat0(O,",");
    printU4ImmOperand(MI,3,O);
    goto LAB_0024fefb;
  case 0xc:
    iVar8 = 3;
LAB_0024ff39:
    printS8ImmOperand(MI,iVar8,O);
    return;
  case 0xd:
    iVar8 = 3;
LAB_0024fbdc:
    printU16ImmOperand(MI,iVar8,O);
    return;
  case 0xe:
    iVar8 = 3;
LAB_0024f81c:
    printU8ImmOperand(MI,iVar8,O);
    return;
  case 0xf:
    goto switchD_0024fe89_caseD_f;
  case 0x10:
    goto switchD_0024fe89_caseD_10;
  case 0x11:
    printU8ImmOperand(MI,2,O);
    O_00 = extraout_RDX_01;
    break;
  case 0x12:
    goto switchD_0024fe89_caseD_12;
  case 0x13:
    goto switchD_0024fe89_caseD_13;
  default:
    goto switchD_0024f803_default;
  }
  switch(uVar3 >> 3 & 0x3f) {
  case 1:
switchD_0024fa90_caseD_f:
    iVar8 = 2;
LAB_0024ffbb:
    printS16ImmOperand(MI,iVar8,O);
    return;
  case 2:
    goto switchD_0024fc34_caseD_14;
  case 3:
    iVar8 = 3;
    goto LAB_002500a1;
  case 4:
    SStream_concat0(O,", ");
  case 0x10:
    iVar8 = 3;
    goto LAB_0024fcd5;
  case 5:
    goto switchD_0024f803_default;
  case 6:
    printU4ImmOperand(MI,2,O);
    break;
  case 7:
    iVar8 = 2;
LAB_002500a1:
    printBDAddrOperand(MI,iVar8,O);
    break;
  case 8:
switchD_0024fc34_caseD_c:
    iVar8 = 2;
    goto LAB_002501d2;
  case 9:
    goto switchD_0024ffb1_caseD_9;
  case 10:
switchD_0024ffb1_caseD_a:
    iVar8 = 1;
    goto LAB_0024f99e;
  case 0xb:
    iVar8 = 1;
    goto LAB_0025011d;
  case 0xc:
    iVar8 = 4;
    goto LAB_0024fb9a;
  case 0xd:
    goto switchD_0024ffb1_caseD_d;
  case 0xe:
    iVar8 = 3;
    goto LAB_0025011d;
  case 0xf:
    pcVar9 = ",";
    goto LAB_002500ec;
  case 0x11:
    goto switchD_0024ffb1_caseD_11;
  case 0x12:
switchD_0024fe89_caseD_2:
    iVar8 = 2;
    goto LAB_0024fb58;
  case 0x13:
    printU8ImmOperand(MI,3,O);
    break;
  case 0x14:
    goto switchD_0024ffb1_caseD_14;
  case 0x15:
    printU8ImmOperand(MI,2,O);
    pcVar9 = ", ";
LAB_002500ec:
    SStream_concat0(O,pcVar9);
    break;
  case 0x16:
    printU12ImmOperand(MI,(int)O,O_00);
    break;
  case 0x17:
switchD_0024fe89_caseD_f:
    iVar8 = 5;
    goto LAB_00250018;
  case 0x18:
switchD_0024fe89_caseD_10:
    iVar8 = 5;
    goto LAB_0024fffa;
  case 0x19:
    iVar8 = 5;
    goto LAB_002500b6;
  case 0x1a:
    iVar8 = 3;
    goto LAB_00250018;
  case 0x1b:
    iVar8 = 3;
    goto LAB_0024fffa;
  case 0x1c:
    iVar8 = 3;
    goto LAB_002500b6;
  case 0x1d:
    printU16ImmOperand(MI,2,O);
    break;
  case 0x1e:
switchD_0024fe89_caseD_12:
    iVar8 = 4;
LAB_00250018:
    printU2ImmOperand(MI,iVar8,O);
    return;
  case 0x1f:
switchD_0024fe89_caseD_13:
    iVar8 = 4;
LAB_0024fffa:
    printU1ImmOperand(MI,iVar8,O);
    return;
  case 0x20:
    iVar8 = 4;
LAB_002500b6:
    printU3ImmOperand(MI,iVar8,O);
    return;
  default:
    iVar8 = 2;
LAB_0025011d:
    printOperand(MI,iVar8,O);
  }
  switch(uVar3 >> 9 & 0xf) {
  case 1:
    SStream_concat0(O,", ");
    break;
  case 2:
    goto switchD_0024fc34_caseD_14;
  case 3:
    printOperand(MI,3,O);
    pcVar9 = ",";
    goto LAB_0024fcc5;
  case 4:
    printU4ImmOperand(MI,3,O);
    break;
  case 5:
    goto switchD_0025016c_caseD_5;
  case 6:
switchD_0024ffb1_caseD_11:
    iVar8 = 3;
LAB_0024fb58:
    printBDXAddrOperand(MI,iVar8,O);
    return;
  case 7:
switchD_0025016c_caseD_7:
    iVar8 = 5;
LAB_0024fb9a:
    printOperand(MI,iVar8,O);
    return;
  case 8:
    printU8ImmOperand(MI,3,O);
LAB_0024fcbe:
    pcVar9 = ", ";
LAB_0024fcc5:
    SStream_concat0(O,pcVar9);
    goto switchD_0024ffb1_caseD_d;
  default:
    goto switchD_0024f803_default;
  }
  switch(((uint)(((ulong)bVar2 << 0x30) >> 0x20) | (uint)uVar3) >> 0xd & 0xf) {
  case 1:
switchD_0025016c_caseD_5:
    iVar8 = 3;
    goto LAB_0024f99e;
  case 2:
switchD_0024fc34_caseD_14:
    iVar8 = 3;
LAB_002501d2:
    printPCRelOperand(MI,iVar8,O);
    return;
  case 3:
switchD_0024ffb1_caseD_d:
    iVar8 = 4;
    goto LAB_0024fcd5;
  case 4:
LAB_0024fefb:
    SStream_concat0(O,",");
  case 5:
switchD_0024ffb1_caseD_9:
    iVar8 = 4;
LAB_0024f99e:
    printBDAddrOperand(MI,iVar8,O);
    return;
  case 6:
    iVar8 = 4;
    goto LAB_00250238;
  case 7:
    printOperand(MI,3,O);
    break;
  case 8:
    iVar8 = 3;
LAB_00250238:
    printU8ImmOperand(MI,iVar8,O);
    break;
  case 9:
    goto switchD_0024f803_default;
  case 10:
    goto switchD_0024ffb1_caseD_14;
  default:
    printU4ImmOperand(MI,3,O);
  }
  if ((bVar2 & 2) == 0) {
switchD_0024f803_default:
    return;
  }
  SStream_concat0(O,", ");
  bVar5 = bVar2 >> 2 & 3;
  if (bVar5 == 1) {
    printU4ImmOperand(MI,4,O);
    if ((bVar2 & 0x10) == 0) {
      return;
    }
    SStream_concat0(O,", ");
  }
  else if (bVar5 != 2) {
    printU6ImmOperand(MI,(int)O,O_01);
    return;
  }
switchD_0024ffb1_caseD_14:
  iVar8 = 5;
LAB_0024fcd5:
  printU4ImmOperand(MI,iVar8,O);
  return;
}

Assistant:

void SystemZ_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
}